

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

void __thiscall gui::Slider::Slider(Slider *this,shared_ptr<gui::SliderStyle> *style,String *name)

{
  String *in_RDX;
  Widget *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<gui::SliderStyle> *in_stack_ffffffffffffffa8;
  shared_ptr<gui::Label> *this_00;
  float local_2c;
  float local_28 [4];
  
  Widget::Widget(in_RSI,in_RDX);
  *in_RDI = &PTR__Slider_004800c8;
  Signal<gui::Widget_*,_float>::Signal((Signal<gui::Widget_*,_float> *)0x28c5cc);
  this_00 = (shared_ptr<gui::Label> *)(in_RDI + 0x43);
  std::shared_ptr<gui::SliderStyle>::shared_ptr
            ((shared_ptr<gui::SliderStyle> *)this_00,in_stack_ffffffffffffffa8);
  *(undefined1 *)(in_RDI + 0x45) = 0;
  sf::Vector2<float>::Vector2((Vector2<float> *)((long)in_RDI + 0x22c),0.0,0.0);
  std::shared_ptr<gui::Label>::shared_ptr(this_00,in_RDI + 0x47);
  local_28[0] = 0.0;
  local_2c = 1.0;
  std::pair<float,_float>::pair<float,_float,_true>
            ((pair<float,_float> *)(in_RDI + 0x49),local_28,&local_2c);
  *(undefined4 *)(in_RDI + 0x4a) = 0;
  *(undefined4 *)((long)in_RDI + 0x254) = 0;
  *(undefined1 *)(in_RDI + 0x4b) = 0;
  return;
}

Assistant:

Slider::Slider(std::shared_ptr<SliderStyle> style, const sf::String& name) :
    baseClass(name),
    style_(style),
    styleCopied_(false),
    size_(0.0f, 0.0f),
    label_(nullptr),
    range_(0.0f, 1.0f),
    value_(0.0f),
    step_(0.0f),
    isDragging_(false) {
}